

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinSelectWithFilterExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinSelectWithFilterExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MatchesClauseSyntax*&>
          (BumpAllocator *this,BinsSelectExpressionSyntax *args,Token *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4,MatchesClauseSyntax **args_5)

{
  Token openParen;
  Token with;
  Token closeParen;
  BinSelectWithFilterExprSyntax *expr;
  Info *in_RCX;
  MatchesClauseSyntax *in_RDX;
  undefined8 in_R8;
  ExpressionSyntax *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  expr = (BinSelectWithFilterExprSyntax *)
         allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  with.info = *(Info **)&in_RDX->super_SyntaxNode;
  with._0_8_ = in_RCX->location;
  openParen.info = (Info *)in_RCX->rawTextPtr;
  openParen._0_8_ = (in_R9->super_SyntaxNode).parent;
  closeParen.info = in_RCX;
  closeParen.kind = (short)in_R8;
  closeParen._2_1_ = (char)((ulong)in_R8 >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  closeParen.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::BinSelectWithFilterExprSyntax::BinSelectWithFilterExprSyntax
            (*(BinSelectWithFilterExprSyntax **)&in_R9->super_SyntaxNode,
             (BinsSelectExpressionSyntax *)expr,with,openParen,in_R9,closeParen,in_RDX);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }